

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

bool __thiscall
metaf::VisibilityGroup::appendVariableMeters
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  int iVar2;
  Type TVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Modifier MVar7;
  long lVar8;
  Modifier MVar9;
  bool bVar10;
  smatch match;
  ulong local_90;
  ulong local_88;
  string_type local_80;
  VisibilityGroup *local_60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if (appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)::
      rgx_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                                 ::rgx_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                  ::rgx_abi_cxx11_,"(\\d\\d\\d\\d)V(\\d\\d\\d\\d)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                    ::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                           ::rgx_abi_cxx11_);
    }
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_58,
                     &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                      ::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&local_58,1);
    if (local_80._M_string_length == 4) {
      iVar2 = std::__cxx11::string::compare((char *)&local_80);
      bVar1 = true;
      if (iVar2 == 0) {
        MVar9 = NONE;
        local_88 = 0;
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        if (3 < local_80._M_string_length) {
          lVar8 = 0;
          do {
            if ((byte)(local_80._M_dataplus._M_p[lVar8] - 0x3aU) < 0xf6) {
              uVar4 = 0;
              uVar5 = 0;
              goto LAB_001a8c23;
            }
            uVar4 = (uint)(byte)(local_80._M_dataplus._M_p[lVar8] - 0x30) + (int)uVar5 * 10;
            uVar5 = (ulong)uVar4;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 4);
          uVar5 = 0x100000000;
LAB_001a8c23:
          uVar5 = uVar4 | uVar5;
        }
        if ((uVar5 & 0x100000000) == 0) goto LAB_001a8c31;
        bVar10 = (int)uVar5 == 9999;
        local_88 = 0x100002710;
        if (!bVar10) {
          local_88 = uVar5;
        }
        MVar9 = (uint)bVar10 * 2;
        uVar5 = local_88 >> 0x20;
        local_88 = local_88 & 0xffffffff;
      }
    }
    else {
LAB_001a8c31:
      MVar9 = NONE;
      local_88 = 0;
      uVar5 = 0;
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_80,&local_58,2);
      local_60 = this;
      if (local_80._M_string_length == 4) {
        iVar2 = std::__cxx11::string::compare((char *)&local_80);
        bVar1 = true;
        if (iVar2 == 0) {
          MVar7 = NONE;
          local_90 = 0;
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          if (3 < local_80._M_string_length) {
            lVar8 = 0;
            do {
              if ((byte)(local_80._M_dataplus._M_p[lVar8] - 0x3aU) < 0xf6) {
                uVar4 = 0;
                uVar6 = 0;
                goto LAB_001a8d2d;
              }
              uVar4 = (uint)(byte)(local_80._M_dataplus._M_p[lVar8] - 0x30) + (int)uVar6 * 10;
              uVar6 = (ulong)uVar4;
              lVar8 = lVar8 + 1;
            } while ((int)lVar8 != 4);
            uVar6 = 0x100000000;
LAB_001a8d2d:
            uVar6 = uVar4 | uVar6;
          }
          if ((uVar6 & 0x100000000) == 0) goto LAB_001a8d3b;
          bVar10 = (int)uVar6 == 9999;
          local_90 = 0x100002710;
          if (!bVar10) {
            local_90 = uVar6;
          }
          MVar7 = (uint)bVar10 * 2;
          uVar6 = local_90 >> 0x20;
          local_90 = local_90 & 0xffffffff;
        }
      }
      else {
LAB_001a8d3b:
        MVar7 = NONE;
        local_90 = 0;
        uVar6 = 0;
        bVar1 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((bVar1) && (uVar5 != 0)) {
        bVar1 = false;
        if (uVar6 == 0) goto LAB_001a8dc7;
        (local_60->vis).distModifier = MVar9;
        (local_60->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)((uVar5 << 0x20) + local_88);
        (local_60->vis).distUnit = METERS;
        (local_60->visMax).distModifier = MVar7;
        (local_60->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)((uVar6 << 0x20) + local_90);
        (local_60->visMax).distUnit = METERS;
        TVar3 = local_60->visType;
        if (TVar3 == PREVAILING) {
          TVar3 = VARIABLE_PREVAILING;
LAB_001a8e29:
          local_60->visType = TVar3;
        }
        else {
          if (TVar3 == SECTOR) {
            TVar3 = VARIABLE_SECTOR;
            goto LAB_001a8e29;
          }
          if (TVar3 == DIRECTIONAL) {
            TVar3 = VARIABLE_DIRECTIONAL;
            goto LAB_001a8e29;
          }
        }
        local_60->incompleteText = next;
        bVar1 = true;
        goto LAB_001a8dc7;
      }
    }
  }
  bVar1 = false;
LAB_001a8dc7:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool VisibilityGroup::appendVariableMeters(const std::string & group, IncompleteText next) {
	static const std::regex rgx("(\\d\\d\\d\\d)V(\\d\\d\\d\\d)");
	static const auto matchMin = 1, matchMax = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return false;
	const auto min = Distance::fromMeterString(match.str(matchMin));
	if (!min.has_value()) return false;
	const auto max = Distance::fromMeterString(match.str(matchMax));
	if (!max.has_value()) return false;
	if (!min->isReported() || !max->isReported()) return false;
	vis = *min;
	visMax = *max;
	makeVariable();
	incompleteText = next;
	return true;
}